

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.cpp
# Opt level: O2

void __thiscall pg::PPSolver::run(PPSolver *this)

{
  Game *pGVar1;
  int *piVar2;
  bitset *pbVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  pointer piVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  ulong *puVar10;
  int *piVar11;
  int *piVar12;
  int *piVar13;
  ostream *poVar14;
  int i;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  uint i_00;
  uint p;
  ulong uVar20;
  
  pGVar1 = (this->super_Solver).game;
  uVar16 = pGVar1->n_vertices;
  piVar2 = pGVar1->_priority;
  iVar15 = *(int *)((long)piVar2 + ((long)((uVar16 << 0x20) + -0x100000000) >> 0x1e));
  uVar20 = (ulong)(iVar15 + 1);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar20;
  uVar9 = SUB168(auVar6 * ZEXT816(0x18),0);
  uVar18 = uVar9 + 8;
  if (0xfffffffffffffff7 < uVar9) {
    uVar18 = 0xffffffffffffffff;
  }
  this->max_prio = iVar15;
  if (SUB168(auVar6 * ZEXT816(0x18),8) != 0) {
    uVar18 = 0xffffffffffffffff;
  }
  puVar10 = (ulong *)operator_new__(uVar18);
  *puVar10 = uVar20;
  if (iVar15 != -1) {
    memset((vector<int,_std::allocator<int>_> *)(puVar10 + 1),0,
           ((uVar9 - 0x18) - (uVar9 - 0x18) % 0x18) + 0x18);
  }
  this->regions = (vector<int,_std::allocator<int>_> *)(puVar10 + 1);
  uVar18 = -(ulong)(uVar16 >> 0x3e != 0) | uVar16 * 4;
  piVar11 = (int *)operator_new__(uVar18);
  this->region = piVar11;
  piVar12 = (int *)operator_new__(uVar18);
  this->strategy = piVar12;
  uVar18 = uVar20 << 2;
  if (iVar15 < -1) {
    uVar18 = 0xffffffffffffffff;
  }
  piVar13 = (int *)operator_new__(uVar18);
  this->inverse = piVar13;
  pbVar3 = (this->super_Solver).disabled;
  uVar18 = ~((long)uVar16 >> 0x3f) & uVar16;
  for (uVar9 = 0; uVar18 != uVar9; uVar9 = uVar9 + 1) {
    iVar15 = -2;
    if ((pbVar3->_bits[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0) {
      iVar15 = piVar2[uVar9];
    }
    piVar11[uVar9] = iVar15;
  }
  for (uVar9 = 0; uVar18 != uVar9; uVar9 = uVar9 + 1) {
    piVar12[uVar9] = -1;
  }
  this->promotions = 0;
  i_00 = (int)uVar16 - 1;
LAB_001518da:
  do {
    if ((int)i_00 < 0) {
LAB_00151a2b:
      pvVar4 = this->regions;
      if (pvVar4 != (vector<int,_std::allocator<int>_> *)0x0) {
        piVar5 = pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (piVar5 != (pointer)0x0) {
          lVar19 = (long)piVar5 * 0x18;
          do {
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)
                       ((long)&pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar19));
            lVar19 = lVar19 + -0x18;
          } while (lVar19 != 0);
        }
        operator_delete__(&pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)piVar5 * 0x18 + 8);
      }
      if (this->region != (int *)0x0) {
        operator_delete__(this->region);
      }
      if (this->strategy != (int *)0x0) {
        operator_delete__(this->strategy);
      }
      if (this->inverse != (int *)0x0) {
        operator_delete__(this->inverse);
      }
      poVar14 = std::operator<<((this->super_Solver).logger,"solved with ");
      poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->promotions);
      poVar14 = std::operator<<(poVar14," promotions.");
      std::endl<char,std::char_traits<char>>(poVar14);
      return;
    }
    piVar2 = ((this->super_Solver).game)->_priority;
    p = piVar2[i_00];
    while( true ) {
      if ((int)i_00 < 0) goto LAB_00151a2b;
      uVar16 = (ulong)i_00;
      if (piVar2[uVar16] != p) {
        if (this->regions[(int)p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            this->regions[(int)p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          resetRegion(this,p);
        }
        goto LAB_001518da;
      }
      if (((((this->super_Solver).disabled)->_bits[i_00 >> 6] >> (uVar16 & 0x3f) & 1) == 0) &&
         (this->region[uVar16] <= (int)p)) break;
      i_00 = i_00 - 1;
    }
    this->inverse[(int)p] = i_00;
    bVar7 = setupRegion(this,i_00,p,true);
    if (!bVar7) {
      for (uVar8 = i_00;
          (i_00 = 0xffffffff, -1 < (int)uVar8 &&
          (i_00 = uVar8, ((this->super_Solver).game)->_priority[uVar8] == p)); uVar8 = uVar8 - 1) {
      }
      goto LAB_001518da;
    }
    while( true ) {
      uVar16 = (ulong)i_00;
      if (1 < (this->super_Solver).trace) {
        reportRegion(this,p);
      }
      uVar8 = (*(this->super_Solver)._vptr_Solver[4])(this,uVar16,(ulong)p);
      if (uVar8 == 0xffffffff) {
        setDominion(this,p);
        i_00 = (int)((this->super_Solver).game)->n_vertices - 1;
        goto LAB_001518da;
      }
      if (uVar8 == 0xfffffffe) break;
      promote(this,p,uVar8);
      i_00 = this->inverse[(int)uVar8];
      p = uVar8;
    }
    uVar8 = 0xffffffff;
    if ((int)i_00 < -1) {
      uVar8 = i_00;
    }
    while ((uVar17 = (uint)uVar16, i_00 = uVar8, -1 < (int)uVar17 &&
           (i_00 = uVar17, ((this->super_Solver).game)->_priority[uVar16] == p))) {
      uVar16 = (ulong)(uVar17 - 1);
    }
  } while( true );
}

Assistant:

void
PPSolver::run()
{
    // obtain highest priority and allocate arrays
    max_prio = priority(nodecount()-1);
    regions = new std::vector<int>[max_prio+1];
    region = new int[nodecount()];
    strategy = new int[nodecount()];
    inverse = new int[max_prio+1];

    // initialize arrays
    for (int i=0; i<nodecount(); i++) region[i] = disabled[i] ? -2 : priority(i);
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // start loop at last node (highest priority)
    int i = nodecount() - 1;

    // reset statistics
    promotions = 0;

    /**
     * Two loops: the outer (normal) loop, and the inner (promotion-chain) loop.
     * The outer loop does region setup and attractor on the full region.
     * The inner loop only attracts from the promoted region.
     */

    while (i >= 0) {
        // get current priority and skip all disabled/attracted nodes
        int p = priority(i);
        while (i >= 0 and priority(i) == p and (disabled[i] or region[i] > p)) i--;
        if (i < 0) break;

        // if empty, possibly reset and continue with next
        if (priority(i) != p) {
            if (!regions[p].empty()) resetRegion(p);
            continue;
        }

        inverse[p] = i;

        // PP: always reset region
        if (setupRegion(i, p, true)) {
            // region not empty, maybe promote
            while (true) {
#ifndef NDEBUG
                if (trace >= 2) reportRegion(p);
#endif
                int res = getRegionStatus(i, p);
                if (res == -2) {
                    // not closed, skip to next priority and break inner loop
                    while (i >= 0 and priority(i) == p) i--;
                    break;
                } else if (res == -1) {
                    // found dominion
                    setDominion(p);
                    // restart algorithm and break inner loop
                    i = nodecount() - 1;
                    break;
                } else {
                    // found promotion, promote
                    promote(p, res);
                    // continue inner loop with the higher priority
                    i = inverse[res];
                    p = res;
                }
            }
        } else {
            // skip to next priority
            while (i >= 0 and priority(i) == p) i--;
        }
    }

    delete[] regions;
    delete[] region;
    delete[] strategy;
    delete[] inverse;

    logger << "solved with " << promotions << " promotions." << std::endl;
}